

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_ctor_and_move_unit_test.cpp
# Opt level: O2

void print_simplex_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>>
               (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *st,string *msg)

{
  pointer pvVar1;
  pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>
  *ppVar2;
  undefined8 uVar3;
  undefined2 uVar4;
  int iVar5;
  ostream *poVar6;
  Filtration_value *__x;
  pointer pvVar7;
  string *__return_storage_ptr__;
  short vertex;
  short sVar8;
  Simplex_handle local_70;
  string local_68;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::initialize_filtration
            (st,false);
  std::operator<<((ostream *)&std::clog,
                  "********************************************************************\n");
  poVar6 = std::operator<<((ostream *)&std::clog,"* ");
  poVar6 = std::operator<<(poVar6,(string *)msg);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&std::clog,"* The complex contains ");
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::num_simplices(st);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6," simplices");
  poVar6 = std::operator<<((ostream *)&std::clog,"   - dimension ");
  iVar5 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::dimension(st);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
  std::operator<<(poVar6,"\n");
  std::operator<<((ostream *)&std::clog,
                  "* Iterator on Simplices in the filtration, with [filtration value]:\n");
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::
  maybe_initialize_filtration(st);
  pvVar1 = (st->filtration_vect_).
           super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar7 = (st->filtration_vect_).
                super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar7 != pvVar1; pvVar7 = pvVar7 + 1) {
    ppVar2 = pvVar7->m_ptr;
    poVar6 = std::operator<<((ostream *)&std::clog,"   ");
    poVar6 = std::operator<<(poVar6,"[");
    __x = (Filtration_value *)&ppVar2->second;
    if (ppVar2 == (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>
                   *)0x0) {
      __x = &Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::
             Filtration_simplex_base_real::inf_;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_48,
               &__x->super_vector<int,_std::allocator<int>_>);
    __return_storage_ptr__ = &local_68;
    print_filtration_value_abi_cxx11_
              (__return_storage_ptr__,(vector<int,_std::allocator<int>_> *)&local_48);
    poVar6 = std::operator<<(poVar6,(string *)__return_storage_ptr__);
    std::operator<<(poVar6,"] ");
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    local_70.m_ptr = ppVar2;
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::simplex_vertex_range
              ((Simplex_vertex_range *)__return_storage_ptr__,st,&local_70);
    uVar4 = local_68.field_2._8_2_;
    uVar3 = local_68.field_2._M_allocated_capacity;
    sVar8 = (short)local_68._M_string_length;
    while ((__return_storage_ptr__ = (string *)(__return_storage_ptr__->_M_dataplus)._M_p,
           __return_storage_ptr__ != (string *)uVar3 || (sVar8 != uVar4))) {
      poVar6 = std::operator<<((ostream *)&std::clog,"(");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar8);
      std::operator<<(poVar6,")");
      sVar8 = (short)__return_storage_ptr__->_M_string_length;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  }
  return;
}

Assistant:

void print_simplex_filtration(const Simplex_tree& st, const std::string& msg) {
  // Required before browsing through filtration values
  st.initialize_filtration();

  std::clog << "********************************************************************\n";
  std::clog << "* " << msg << "\n";
  std::clog << "* The complex contains " << st.num_simplices() << " simplices";
  std::clog << "   - dimension " << st.dimension() << "\n";
  std::clog << "* Iterator on Simplices in the filtration, with [filtration value]:\n";
  for (auto f_simplex : st.filtration_simplex_range()) {
    std::clog << "   "
              << "[" << print_filtration_value(st.filtration(f_simplex)) << "] ";
    for (auto vertex : st.simplex_vertex_range(f_simplex)) std::clog << "(" << vertex << ")";
    std::clog << std::endl;
  }

}